

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O2

bool AString_reserve(AString *str,size_t reserveSize)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  bVar3 = false;
  if (str != (AString *)0x0) {
    if (str->capacity < reserveSize) {
      if (reserveSize < 8) {
        uVar4 = 8;
      }
      else {
        auVar6._8_4_ = (int)(reserveSize >> 0x20);
        auVar6._0_8_ = reserveSize;
        auVar6._12_4_ = 0x45300000;
        dVar5 = log(((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)reserveSize) - 4503599627370496.0)) * 0.5);
        dVar5 = ceil(dVar5 / 0.6931471805599453);
        dVar5 = exp2(dVar5);
        uVar1 = (ulong)(dVar5 + dVar5);
        uVar1 = (long)((dVar5 + dVar5) - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
        uVar4 = reserveSize + 0x400;
        if (uVar1 - reserveSize < 0x401) {
          uVar4 = uVar1;
        }
      }
      if (uVar4 < reserveSize) {
        return false;
      }
      pcVar2 = (char *)(*str->reallocator)(str->buffer,uVar4 + 1);
      if (pcVar2 == (char *)0x0) {
        return false;
      }
      str->capacity = uVar4;
      str->buffer = pcVar2;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

ACUTILS_HD_FUNC bool AString_reserve(struct AString *str, size_t reserveSize)
{
    if(str != nullptr) {
        if(reserveSize > str->capacity) {
            size_t aimedCapacity = private_ACUtils_AString_capacityMin;
            if(reserveSize >= private_ACUtils_AString_capacityMin) {
                double multiplierExponent =
                        (ceil(log((double) reserveSize / 2) / log(private_ACUtils_AString_capacityMul)));
                aimedCapacity = (size_t) (2 * pow((double) private_ACUtils_AString_capacityMul, multiplierExponent));
                if(aimedCapacity - reserveSize > private_ACUtils_AString_capacityAllocMax)
                    aimedCapacity = reserveSize + private_ACUtils_AString_capacityAllocMax;
            }
            if(aimedCapacity >= reserveSize) {
                char *tmpBuffer = (char*) str->reallocator(str->buffer, (aimedCapacity + 1) * sizeof(char));
                if(tmpBuffer != nullptr) {
                    str->capacity = aimedCapacity;
                    str->buffer = tmpBuffer;
                    return true;
                }
            }
        } else {
            return true;
        }
    }
    return false;
}